

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderCompilationCases.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Performance::ShaderCompilerCase::init(ShaderCompilerCase *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int iVar2;
  int iVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  RenderTarget *renderTarget;
  Functions *gl;
  ShaderCompilerCase *this_local;
  
  pRVar4 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar4->_vptr_RenderContext[3])();
  pRVar4 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[4])();
  iVar3 = tcu::RenderTarget::getWidth((RenderTarget *)CONCAT44(extraout_var_00,iVar2));
  iVar3 = ::deMin32(0x40,iVar3);
  this->m_viewportWidth = iVar3;
  iVar2 = tcu::RenderTarget::getHeight((RenderTarget *)CONCAT44(extraout_var_00,iVar2));
  iVar2 = ::deMin32(0x40,iVar2);
  this->m_viewportHeight = iVar2;
  iVar1 = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x1a00))
                    (0,0,this->m_viewportWidth,this->m_viewportHeight);
  return iVar1;
}

Assistant:

void ShaderCompilerCase::init (void)
{
	const glw::Functions&		gl				= m_context.getRenderContext().getFunctions();
	const tcu::RenderTarget&	renderTarget	= m_context.getRenderContext().getRenderTarget();

	m_viewportWidth		= deMin32(MAX_VIEWPORT_WIDTH, renderTarget.getWidth());
	m_viewportHeight	= deMin32(MAX_VIEWPORT_HEIGHT, renderTarget.getHeight());

	gl.viewport(0, 0, m_viewportWidth, m_viewportHeight);
}